

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O3

bool __thiscall SessionManager::haveSession(SessionManager *this,CK_SLOT_ID slotID)

{
  Slot *this_00;
  CK_SLOT_ID CVar1;
  pointer ppSVar2;
  bool bVar3;
  pointer ppSVar4;
  MutexLocker lock;
  MutexLocker MStack_28;
  
  MutexLocker::MutexLocker(&MStack_28,this->sessionsMutex);
  ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar2 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppSVar4 == ppSVar2) {
      bVar3 = false;
LAB_0016f46a:
      MutexLocker::~MutexLocker(&MStack_28);
      return bVar3;
    }
    if (*ppSVar4 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar4);
      CVar1 = Slot::getSlotID(this_00);
      if (CVar1 == slotID) {
        bVar3 = true;
        goto LAB_0016f46a;
      }
      ppSVar2 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    ppSVar4 = ppSVar4 + 1;
  } while( true );
}

Assistant:

bool SessionManager::haveSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			return true;
		}
	}

	return false;
}